

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

void __thiscall
helics::RandomDelayFilterOperation::set
          (RandomDelayFilterOperation *this,string_view property,double val)

{
  int iVar1;
  char *__s1;
  size_t __n;
  long lVar2;
  size_type __rlen;
  
  __s1 = property._M_str;
  __n = property._M_len;
  lVar2 = __n - 3;
  switch(lVar2) {
  case 0:
switchD_0020f69e_caseD_0:
    iVar1 = bcmp(__s1,"min",__n);
    if (iVar1 != 0) {
      switch(lVar2) {
      case 0:
        goto switchD_0020f6d2_caseD_0;
      case 1:
        goto switchD_0020f73a_caseD_1;
      case 2:
        goto switchD_0020f69e_caseD_2;
      case 3:
        goto switchD_0020f706_caseD_3;
      default:
        goto switchD_0020f69e_default;
      }
    }
    goto LAB_0020f7f6;
  case 1:
switchD_0020f69e_caseD_1:
    iVar1 = bcmp(__s1,"mean",__n);
    if (iVar1 != 0) {
      switch(lVar2) {
      case 0:
        goto switchD_0020f69e_caseD_0;
      case 1:
        goto switchD_0020f73a_caseD_1;
      case 2:
        goto switchD_0020f69e_caseD_2;
      case 3:
        goto switchD_0020f706_caseD_3;
      default:
        goto switchD_0020f69e_default;
      }
    }
    goto LAB_0020f7f6;
  case 2:
    break;
  case 3:
    iVar1 = bcmp(__s1,"param1",__n);
    if (iVar1 != 0) {
      switch(lVar2) {
      case 0:
        goto switchD_0020f69e_caseD_0;
      case 1:
        goto switchD_0020f69e_caseD_1;
      case 2:
        goto switchD_0020f69e_caseD_2;
      case 3:
        goto switchD_0020f706_caseD_3;
      default:
        goto switchD_0020f69e_default;
      }
    }
    goto LAB_0020f7f6;
  default:
    goto switchD_0020f69e_default;
  }
switchD_0020f69e_caseD_2:
  iVar1 = bcmp(__s1,"alpha",__n);
  if (iVar1 == 0) {
LAB_0020f7f6:
    lVar2 = 8;
  }
  else if (__n == 3) {
switchD_0020f6d2_caseD_0:
    iVar1 = bcmp(__s1,"max",__n);
    if (iVar1 != 0) {
      if (__n != 4) {
        return;
      }
switchD_0020f73a_caseD_1:
      iVar1 = bcmp(__s1,"beta",__n);
      if (iVar1 != 0) {
        return;
      }
    }
    lVar2 = 0x10;
  }
  else {
    if (__n == 4) goto switchD_0020f73a_caseD_1;
    if (__n != 6) {
      return;
    }
switchD_0020f706_caseD_3:
    iVar1 = bcmp(__s1,"param2",__n);
    lVar2 = 0x10;
    if (iVar1 != 0) {
      if (__n == 3) goto switchD_0020f6d2_caseD_0;
      if (__n == 4) goto switchD_0020f73a_caseD_1;
      if (__n != 6) {
        return;
      }
      iVar1 = bcmp(__s1,"stddev",6);
      if (iVar1 != 0) {
        return;
      }
    }
  }
  LOCK();
  *(double *)
   ((long)&(((this->rdelayGen)._M_t.
             super___uniq_ptr_impl<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::RandomDelayGenerator_*,_std::default_delete<helics::RandomDelayGenerator>_>
             .super__Head_base<0UL,_helics::RandomDelayGenerator_*,_false>._M_head_impl)->dist)._M_i
   + lVar2) = val;
  UNLOCK();
switchD_0020f69e_default:
  return;
}

Assistant:

void RandomDelayFilterOperation::set(std::string_view property, double val)
{
    if ((property == "param1") || (property == "mean") || (property == "min") ||
        (property == "alpha")) {
        rdelayGen->param1.store(val);
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        rdelayGen->param2.store(val);
    }
}